

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O1

coda_product_definition *
coda_product_type_get_latest_product_definition(coda_product_type *product_type)

{
  uint uVar1;
  coda_product_definition **ppcVar2;
  ulong uVar3;
  coda_product_definition *pcVar4;
  int iVar5;
  ulong uVar6;
  
  uVar1 = product_type->num_product_definitions;
  if ((ulong)uVar1 == 0) {
    pcVar4 = (coda_product_definition *)0x0;
    coda_set_error(-400,"product type %s does not contain any definitions",product_type->name);
  }
  else {
    ppcVar2 = product_type->product_definition;
    uVar3 = 0;
    if (1 < (int)uVar1) {
      iVar5 = (*ppcVar2)->version;
      uVar6 = 1;
      do {
        if (iVar5 < ppcVar2[uVar6]->version) {
          uVar3 = uVar6 & 0xffffffff;
          iVar5 = ppcVar2[uVar6]->version;
        }
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
      uVar3 = (ulong)(int)uVar3;
    }
    pcVar4 = ppcVar2[uVar3];
  }
  return pcVar4;
}

Assistant:

coda_product_definition *coda_product_type_get_latest_product_definition(const coda_product_type *product_type)
{
    int max_version;
    int max_i;
    int i;

    if (product_type->num_product_definitions == 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "product type %s does not contain any definitions",
                       product_type->name);
        return NULL;
    }
    max_version = product_type->product_definition[0]->version;
    max_i = 0;
    for (i = 1; i < product_type->num_product_definitions; i++)
    {
        if (product_type->product_definition[i]->version > max_version)
        {
            max_version = product_type->product_definition[i]->version;
            max_i = i;
        }
    }

    return product_type->product_definition[max_i];
}